

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_fourier_transform_cepstral_analysis.h
# Opt level: O1

void __thiscall sptk::FastFourierTransformCepstralAnalysis::Buffer::~Buffer(Buffer *this)

{
  pointer pdVar1;
  
  this->_vptr_Buffer = (_func_int **)&PTR__Buffer_00115778;
  (this->buffer_for_inverse_fast_fourier_transform_)._vptr_Buffer =
       (_func_int **)&PTR__Buffer_001157a8;
  RealValuedFastFourierTransform::Buffer::~Buffer
            (&(this->buffer_for_inverse_fast_fourier_transform_).fast_fourier_transform_buffer_);
  RealValuedFastFourierTransform::Buffer::~Buffer(&this->buffer_for_fast_fourier_transform_);
  pdVar1 = (this->imag_part_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1);
  }
  pdVar1 = (this->real_part_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1);
    return;
  }
  return;
}

Assistant:

virtual ~Buffer() {
    }